

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortSymbols.cpp
# Opt level: O0

pair<slang::ast::ArgumentDirection,_const_slang::ast::Type_*>
slang::ast::getDirAndType(Symbol *port)

{
  ArgumentDirection *pAVar1;
  int *in_RDI;
  pair<slang::ast::ArgumentDirection,_const_slang::ast::Type_*> pVar2;
  MultiPortSymbol *mp;
  PortSymbol *ps;
  MultiPortSymbol *in_stack_00000098;
  PortSymbol *in_stack_000001c8;
  Type *local_38;
  MultiPortSymbol *local_30;
  Type *local_28;
  PortSymbol *local_20;
  pair<slang::ast::ArgumentDirection,_const_slang::ast::Type_*> local_10;
  
  if (*in_RDI == 0x29) {
    local_20 = Symbol::as<slang::ast::PortSymbol>((Symbol *)0x4691fd);
    pAVar1 = &local_20->direction;
    local_28 = PortSymbol::getType(in_stack_000001c8);
    std::pair<slang::ast::ArgumentDirection,_const_slang::ast::Type_*>::
    pair<const_slang::ast::Type_*,_true>(&local_10,pAVar1,&local_28);
  }
  else {
    local_30 = Symbol::as<slang::ast::MultiPortSymbol>((Symbol *)0x46923f);
    pAVar1 = &local_30->direction;
    local_38 = MultiPortSymbol::getType(in_stack_00000098);
    std::pair<slang::ast::ArgumentDirection,_const_slang::ast::Type_*>::
    pair<const_slang::ast::Type_*,_true>(&local_10,pAVar1,&local_38);
  }
  pVar2._4_4_ = 0;
  pVar2.first = local_10.first;
  pVar2.second = local_10.second;
  return pVar2;
}

Assistant:

static std::pair<ArgumentDirection, const Type*> getDirAndType(const Symbol& port) {
    if (port.kind == SymbolKind::Port) {
        auto& ps = port.as<PortSymbol>();
        return {ps.direction, &ps.getType()};
    }
    else {
        auto& mp = port.as<MultiPortSymbol>();
        return {mp.direction, &mp.getType()};
    }
}